

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O0

void nhdp_interface_apply_settings(nhdp_interface *interf)

{
  uint64_t local_30;
  uint64_t vtime;
  uint64_t itime;
  nhdp_interface *interf_local;
  
  _cb_interface_event(&interf->rfc5444_if,false);
  vtime = interf->overwrite_hello_interval;
  if (vtime == 0) {
    vtime = interf->hello_interval;
  }
  local_30 = interf->overwrite_hello_validity;
  if (local_30 == 0) {
    local_30 = interf->validity_time;
  }
  oonf_timer_set_ext(&interf->_hello_timer,vtime,vtime);
  interf->refresh_interval = vtime;
  interf->h_hold_time = local_30;
  interf->l_hold_time = local_30;
  interf->n_hold_time = local_30;
  interf->i_hold_time = local_30;
  return;
}

Assistant:

void
nhdp_interface_apply_settings(struct nhdp_interface *interf) {
  uint64_t itime, vtime;
  /* parse ip address list again and apply ACL */
  _cb_interface_event(&interf->rfc5444_if, false);

  /* calculate interval and validity time */
  itime = interf->overwrite_hello_interval;
  if (!itime) {
    itime = interf->hello_interval;
  }
  vtime = interf->overwrite_hello_validity;
  if (!vtime) {
    vtime = interf->validity_time;
  }

  /* reset hello generation frequency */
  oonf_timer_set(&interf->_hello_timer, itime);

  interf->refresh_interval = itime;

  /* just copy validity_time for now */
  interf->h_hold_time = vtime;
  interf->l_hold_time = vtime;
  interf->n_hold_time = vtime;
  interf->i_hold_time = vtime;
}